

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  float *pfVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [12];
  bool bVar26;
  uint uVar27;
  undefined4 uVar28;
  int iVar29;
  float *vertices;
  long lVar30;
  long lVar31;
  ulong uVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  size_t sVar34;
  ulong uVar35;
  size_t sVar36;
  uint uVar37;
  NodeRef *pNVar38;
  NodeRef root;
  size_t i_1;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  float fVar114;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  float fVar123;
  float fVar126;
  float fVar127;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar124;
  undefined1 auVar125 [16];
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  Precalculations pre;
  vbool<4> terminated;
  float local_1aa8;
  float fStack_1aa4;
  float fStack_1aa0;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a58 [16];
  undefined1 local_1a38 [16];
  BVH *local_1a28;
  Intersectors *local_1a20;
  long local_1a18;
  long local_1a10;
  Scene *local_1a08;
  vuint<4> *v;
  TravRayK<4,_true> tray;
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [8];
  float fStack_18b0;
  float fStack_18ac;
  undefined1 local_18a8 [8];
  float fStack_18a0;
  float fStack_189c;
  longlong local_17e8;
  longlong lStack_17e0;
  longlong local_17d8;
  longlong lStack_17d0;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1798;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  uint uStack_1718;
  uint uStack_1714;
  uint uStack_1710;
  uint uStack_170c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1a28 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1a28->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar63 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar76 = vpcmpeqd_avx(auVar63,(undefined1  [16])valid_i->field_0);
    auVar53 = ZEXT816(0) << 0x40;
    auVar12 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53,5);
    auVar64 = auVar76 & auVar12;
    if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar64[0xf] < '\0')
    {
      auVar12 = vandps_avx(auVar12,auVar76);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar115._8_4_ = 0x7fffffff;
      auVar115._0_8_ = 0x7fffffff7fffffff;
      auVar115._12_4_ = 0x7fffffff;
      auVar76 = vandps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar108._8_4_ = 0x219392ef;
      auVar108._0_8_ = 0x219392ef219392ef;
      auVar108._12_4_ = 0x219392ef;
      auVar64 = vcmpps_avx(auVar76,auVar108,1);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = 0x3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar95 = vdivps_avx(auVar120,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar76 = vandps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar87 = vcmpps_avx(auVar76,auVar108,1);
      auVar96 = vdivps_avx(auVar120,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar76 = vandps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar76 = vcmpps_avx(auVar76,auVar108,1);
      auVar97 = vdivps_avx(auVar120,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar109._8_4_ = 0x5d5e0b6b;
      auVar109._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar109._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar95,auVar109,auVar64);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar96,auVar109,auVar87);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar97,auVar109,auVar76);
      auVar76 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar53,1);
      auVar95._8_4_ = 0x10;
      auVar95._0_8_ = 0x1000000010;
      auVar95._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar76,auVar95);
      auVar76 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar53,5);
      auVar64._8_4_ = 0x20;
      auVar64._0_8_ = 0x2000000020;
      auVar64._12_4_ = 0x20;
      auVar96._8_4_ = 0x30;
      auVar96._0_8_ = 0x3000000030;
      auVar96._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar96,auVar64,auVar76);
      auVar76 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar53,5);
      auVar87._8_4_ = 0x40;
      auVar87._0_8_ = 0x4000000040;
      auVar87._12_4_ = 0x40;
      auVar97._8_4_ = 0x50;
      auVar97._0_8_ = 0x5000000050;
      auVar97._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar97,auVar87,auVar76);
      auVar76 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar53);
      auVar64 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar121 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar76,auVar12);
      auVar68 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar76._8_4_ = 0xff800000;
      auVar76._0_8_ = 0xff800000ff800000;
      auVar76._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar76,auVar64,auVar12);
      terminated.field_0.i[1] = auVar12._4_4_ ^ auVar63._4_4_;
      terminated.field_0.i[0] = auVar12._0_4_ ^ auVar63._0_4_;
      terminated.field_0.i[2] = auVar12._8_4_ ^ auVar63._8_4_;
      terminated.field_0.i[3] = auVar12._12_4_ ^ auVar63._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar37 = 3;
      }
      else {
        uVar37 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar113 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar122 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      local_1a20 = This;
LAB_0154384b:
      do {
        do {
          root.ptr = pNVar38[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015444eb;
          pNVar38 = pNVar38 + -1;
          paVar33 = paVar33 + -1;
          aVar124 = *paVar33;
          auVar63 = vcmpps_avx((undefined1  [16])aVar124,(undefined1  [16])tray.tfar.field_0,1);
          uVar27 = vmovmskps_avx(auVar63);
        } while (uVar27 == 0);
        uVar32 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        if (uVar37 < uVar27) {
LAB_0154388a:
          iVar29 = 4;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015444eb;
              auVar63 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar124,6);
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar63[0xf]) goto LAB_0154384b;
              local_1a18 = (ulong)((uint)root.ptr & 0xf) - 8;
              auVar63 = vpcmpeqd_avx(auVar63,auVar63);
              lVar31 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              lVar30 = 0;
              local_1a58 = auVar63 ^ (undefined1  [16])terminated.field_0;
              goto LAB_01543a82;
            }
            sVar36 = 8;
            aVar124 = auVar121._0_16_;
            for (lVar31 = 0;
                (lVar31 != 4 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar31 * 8), sVar4 != 8));
                lVar31 = lVar31 + 1) {
              uVar28 = *(undefined4 *)(root.ptr + 0x20 + lVar31 * 4);
              auVar40._4_4_ = uVar28;
              auVar40._0_4_ = uVar28;
              auVar40._8_4_ = uVar28;
              auVar40._12_4_ = uVar28;
              auVar21._8_8_ = tray.org.field_0._8_8_;
              auVar21._0_8_ = tray.org.field_0._0_8_;
              auVar22._8_8_ = tray.org.field_0._24_8_;
              auVar22._0_8_ = tray.org.field_0._16_8_;
              auVar23._8_8_ = tray.org.field_0._40_8_;
              auVar23._0_8_ = tray.org.field_0._32_8_;
              auVar63 = vsubps_avx(auVar40,auVar21);
              auVar88._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar63._0_4_;
              auVar88._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar63._4_4_;
              auVar88._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar63._8_4_;
              auVar88._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar63._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x40 + lVar31 * 4);
              auVar41._4_4_ = uVar28;
              auVar41._0_4_ = uVar28;
              auVar41._8_4_ = uVar28;
              auVar41._12_4_ = uVar28;
              auVar63 = vsubps_avx(auVar41,auVar22);
              auVar102._0_4_ = tray.rdir.field_0._16_4_ * auVar63._0_4_;
              auVar102._4_4_ = tray.rdir.field_0._20_4_ * auVar63._4_4_;
              auVar102._8_4_ = tray.rdir.field_0._24_4_ * auVar63._8_4_;
              auVar102._12_4_ = tray.rdir.field_0._28_4_ * auVar63._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x60 + lVar31 * 4);
              auVar42._4_4_ = uVar28;
              auVar42._0_4_ = uVar28;
              auVar42._8_4_ = uVar28;
              auVar42._12_4_ = uVar28;
              auVar63 = vsubps_avx(auVar42,auVar23);
              auVar110._0_4_ = tray.rdir.field_0._32_4_ * auVar63._0_4_;
              auVar110._4_4_ = tray.rdir.field_0._36_4_ * auVar63._4_4_;
              auVar110._8_4_ = tray.rdir.field_0._40_4_ * auVar63._8_4_;
              auVar110._12_4_ = tray.rdir.field_0._44_4_ * auVar63._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x30 + lVar31 * 4);
              auVar43._4_4_ = uVar28;
              auVar43._0_4_ = uVar28;
              auVar43._8_4_ = uVar28;
              auVar43._12_4_ = uVar28;
              auVar63 = vsubps_avx(auVar43,auVar21);
              auVar55._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar63._0_4_;
              auVar55._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar63._4_4_;
              auVar55._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar63._8_4_;
              auVar55._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar63._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x50 + lVar31 * 4);
              auVar44._4_4_ = uVar28;
              auVar44._0_4_ = uVar28;
              auVar44._8_4_ = uVar28;
              auVar44._12_4_ = uVar28;
              auVar63 = vsubps_avx(auVar44,auVar22);
              auVar69._0_4_ = tray.rdir.field_0._16_4_ * auVar63._0_4_;
              auVar69._4_4_ = tray.rdir.field_0._20_4_ * auVar63._4_4_;
              auVar69._8_4_ = tray.rdir.field_0._24_4_ * auVar63._8_4_;
              auVar69._12_4_ = tray.rdir.field_0._28_4_ * auVar63._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x70 + lVar31 * 4);
              auVar45._4_4_ = uVar28;
              auVar45._0_4_ = uVar28;
              auVar45._8_4_ = uVar28;
              auVar45._12_4_ = uVar28;
              auVar63 = vsubps_avx(auVar45,auVar23);
              auVar77._0_4_ = tray.rdir.field_0._32_4_ * auVar63._0_4_;
              auVar77._4_4_ = tray.rdir.field_0._36_4_ * auVar63._4_4_;
              auVar77._8_4_ = tray.rdir.field_0._40_4_ * auVar63._8_4_;
              auVar77._12_4_ = tray.rdir.field_0._44_4_ * auVar63._12_4_;
              auVar63 = vminps_avx(auVar88,auVar55);
              auVar76 = vminps_avx(auVar102,auVar69);
              auVar63 = vmaxps_avx(auVar63,auVar76);
              auVar76 = vminps_avx(auVar110,auVar77);
              auVar63 = vmaxps_avx(auVar63,auVar76);
              auVar46._0_4_ = auVar113._0_4_ * auVar63._0_4_;
              auVar46._4_4_ = auVar113._4_4_ * auVar63._4_4_;
              auVar46._8_4_ = auVar113._8_4_ * auVar63._8_4_;
              auVar46._12_4_ = auVar113._12_4_ * auVar63._12_4_;
              auVar63 = vmaxps_avx(auVar88,auVar55);
              auVar76 = vmaxps_avx(auVar102,auVar69);
              auVar76 = vminps_avx(auVar63,auVar76);
              auVar63 = vmaxps_avx(auVar110,auVar77);
              auVar63 = vminps_avx(auVar76,auVar63);
              auVar56._0_4_ = auVar122._0_4_ * auVar63._0_4_;
              auVar56._4_4_ = auVar122._4_4_ * auVar63._4_4_;
              auVar56._8_4_ = auVar122._8_4_ * auVar63._8_4_;
              auVar56._12_4_ = auVar122._12_4_ * auVar63._12_4_;
              auVar63 = vmaxps_avx(auVar46,(undefined1  [16])tray.tnear.field_0);
              auVar76 = vminps_avx(auVar56,(undefined1  [16])tray.tfar.field_0);
              auVar63 = vcmpps_avx(auVar63,auVar76,2);
              auVar68 = ZEXT1664(auVar63);
              sVar34 = sVar36;
              aVar11 = aVar124;
              if (((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar63[0xf] < '\0') &&
                 (aVar11.v = (__m128)vblendvps_avx(auVar121._0_16_,auVar46,auVar63), sVar34 = sVar4,
                 sVar36 != 8)) {
                pNVar38->ptr = sVar36;
                pNVar38 = pNVar38 + 1;
                *paVar33 = aVar124;
                paVar33 = paVar33 + 1;
              }
              aVar124 = aVar11;
              sVar36 = sVar34;
            }
            if (sVar36 == 8) goto LAB_01543a10;
            auVar63 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar124,6);
            uVar28 = vmovmskps_avx(auVar63);
            root.ptr = sVar36;
          } while ((byte)uVar37 < (byte)POPCOUNT(uVar28));
          pNVar38->ptr = sVar36;
          pNVar38 = pNVar38 + 1;
          *paVar33 = aVar124;
          paVar33 = paVar33 + 1;
        }
        else {
          while (uVar32 != 0) {
            sVar36 = 0;
            for (uVar35 = uVar32; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              sVar36 = sVar36 + 1;
            }
            uVar32 = uVar32 - 1 & uVar32;
            auVar68 = ZEXT1664(auVar68._0_16_);
            bVar26 = occluded1(local_1a20,local_1a28,root,sVar36,&pre,ray,&tray,context);
            if (bVar26) {
              terminated.field_0.i[sVar36] = -1;
            }
          }
          auVar63 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar29 = 3;
          auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar113 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar122 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') {
            auVar68 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar63._8_4_ = 0xff800000;
            auVar63._0_8_ = 0xff800000ff800000;
            auVar63._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar63,
                               (undefined1  [16])terminated.field_0);
            iVar29 = 2;
          }
          if (uVar37 < uVar27) goto LAB_0154388a;
        }
LAB_01543a10:
      } while ((iVar29 == 4) || (iVar29 == 2));
LAB_015444eb:
      auVar12 = vandps_avx(auVar12,(undefined1  [16])terminated.field_0);
      auVar67._8_4_ = 0xff800000;
      auVar67._0_8_ = 0xff800000ff800000;
      auVar67._12_4_ = 0xff800000;
      auVar12 = vmaskmovps_avx(auVar12,auVar67);
      *(undefined1 (*) [16])pRVar1 = auVar12;
    }
  }
  return;
LAB_01543a82:
  do {
    auVar63 = auVar68._0_16_;
    if (lVar30 == local_1a18) break;
    v = (vuint<4> *)(lVar30 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    local_1a08 = context->scene;
    lVar39 = 0;
    auVar76 = local_1a58;
    local_1a10 = lVar30;
    do {
      if ((lVar39 == 4) || (*(int *)(lVar31 + lVar39 * 4) == -1)) break;
      pfVar5 = (local_1a08->vertices).items[*(uint *)(lVar31 + -0x10 + lVar39 * 4)];
      uVar32 = (ulong)*(uint *)(lVar31 + -0x40 + lVar39 * 4);
      uVar35 = (ulong)*(uint *)(lVar31 + -0x30 + lVar39 * 4);
      fVar2 = pfVar5[uVar32];
      auVar47._4_4_ = fVar2;
      auVar47._0_4_ = fVar2;
      auVar47._8_4_ = fVar2;
      auVar47._12_4_ = fVar2;
      fVar2 = pfVar5[uVar32 + 1];
      auVar57._4_4_ = fVar2;
      auVar57._0_4_ = fVar2;
      auVar57._8_4_ = fVar2;
      auVar57._12_4_ = fVar2;
      fVar2 = pfVar5[uVar32 + 2];
      auVar70._4_4_ = fVar2;
      auVar70._0_4_ = fVar2;
      auVar70._8_4_ = fVar2;
      auVar70._12_4_ = fVar2;
      fVar2 = pfVar5[uVar35];
      auVar78._4_4_ = fVar2;
      auVar78._0_4_ = fVar2;
      auVar78._8_4_ = fVar2;
      auVar78._12_4_ = fVar2;
      fVar2 = pfVar5[uVar35 + 1];
      auVar83._4_4_ = fVar2;
      auVar83._0_4_ = fVar2;
      auVar83._8_4_ = fVar2;
      auVar83._12_4_ = fVar2;
      fVar2 = pfVar5[uVar35 + 2];
      auVar89._4_4_ = fVar2;
      auVar89._0_4_ = fVar2;
      auVar89._8_4_ = fVar2;
      auVar89._12_4_ = fVar2;
      uVar32 = (ulong)*(uint *)(lVar31 + -0x20 + lVar39 * 4);
      fVar2 = pfVar5[uVar32];
      auVar98._4_4_ = fVar2;
      auVar98._0_4_ = fVar2;
      auVar98._8_4_ = fVar2;
      auVar98._12_4_ = fVar2;
      fVar2 = pfVar5[uVar32 + 1];
      auVar125._4_4_ = fVar2;
      auVar125._0_4_ = fVar2;
      auVar125._8_4_ = fVar2;
      auVar125._12_4_ = fVar2;
      fVar2 = pfVar5[uVar32 + 2];
      auVar105._4_4_ = fVar2;
      auVar105._0_4_ = fVar2;
      auVar105._8_4_ = fVar2;
      auVar105._12_4_ = fVar2;
      local_17d8 = v[3].field_0.v[0];
      lStack_17d0 = v[3].field_0.v[1];
      local_17e8 = v[4].field_0.v[0];
      lStack_17e0 = v[4].field_0.v[1];
      auVar63 = *(undefined1 (*) [16])ray;
      auVar64 = *(undefined1 (*) [16])(ray + 0x10);
      auVar53 = *(undefined1 (*) [16])(ray + 0x20);
      auVar95 = vsubps_avx(auVar47,auVar63);
      auVar96 = vsubps_avx(auVar57,auVar64);
      auVar87 = vsubps_avx(auVar70,auVar53);
      auVar97 = vsubps_avx(auVar78,auVar63);
      auVar108 = vsubps_avx(auVar83,auVar64);
      auVar109 = vsubps_avx(auVar89,auVar53);
      auVar120 = vsubps_avx(auVar98,auVar63);
      auVar47 = vsubps_avx(auVar125,auVar64);
      auVar53 = vsubps_avx(auVar105,auVar53);
      auVar57 = vsubps_avx(auVar120,auVar95);
      auVar70 = vsubps_avx(auVar47,auVar96);
      auVar78 = vsubps_avx(auVar53,auVar87);
      auVar79._0_4_ = auVar120._0_4_ + auVar95._0_4_;
      auVar79._4_4_ = auVar120._4_4_ + auVar95._4_4_;
      auVar79._8_4_ = auVar120._8_4_ + auVar95._8_4_;
      auVar79._12_4_ = auVar120._12_4_ + auVar95._12_4_;
      auVar99._0_4_ = auVar96._0_4_ + auVar47._0_4_;
      auVar99._4_4_ = auVar96._4_4_ + auVar47._4_4_;
      auVar99._8_4_ = auVar96._8_4_ + auVar47._8_4_;
      auVar99._12_4_ = auVar96._12_4_ + auVar47._12_4_;
      fVar2 = auVar87._0_4_;
      auVar106._0_4_ = auVar53._0_4_ + fVar2;
      fVar8 = auVar87._4_4_;
      auVar106._4_4_ = auVar53._4_4_ + fVar8;
      fVar9 = auVar87._8_4_;
      auVar106._8_4_ = auVar53._8_4_ + fVar9;
      fVar10 = auVar87._12_4_;
      auVar106._12_4_ = auVar53._12_4_ + fVar10;
      auVar116._0_4_ = auVar78._0_4_ * auVar99._0_4_;
      auVar116._4_4_ = auVar78._4_4_ * auVar99._4_4_;
      auVar116._8_4_ = auVar78._8_4_ * auVar99._8_4_;
      auVar116._12_4_ = auVar78._12_4_ * auVar99._12_4_;
      auVar83 = vfmsub231ps_fma(auVar116,auVar70,auVar106);
      auVar112._0_4_ = auVar106._0_4_ * auVar57._0_4_;
      auVar112._4_4_ = auVar106._4_4_ * auVar57._4_4_;
      auVar112._8_4_ = auVar106._8_4_ * auVar57._8_4_;
      auVar112._12_4_ = auVar106._12_4_ * auVar57._12_4_;
      auVar64 = vfmsub231ps_fma(auVar112,auVar78,auVar79);
      auVar80._0_4_ = auVar70._0_4_ * auVar79._0_4_;
      auVar80._4_4_ = auVar70._4_4_ * auVar79._4_4_;
      auVar80._8_4_ = auVar70._8_4_ * auVar79._8_4_;
      auVar80._12_4_ = auVar70._12_4_ * auVar79._12_4_;
      auVar63 = vfmsub231ps_fma(auVar80,auVar57,auVar99);
      fVar17 = *(float *)(ray + 0x60);
      fVar18 = *(float *)(ray + 100);
      fVar19 = *(float *)(ray + 0x68);
      auVar25 = *(undefined1 (*) [12])(ray + 0x60);
      fVar20 = *(float *)(ray + 0x6c);
      auVar81._0_4_ = fVar17 * auVar63._0_4_;
      auVar81._4_4_ = fVar18 * auVar63._4_4_;
      auVar81._8_4_ = fVar19 * auVar63._8_4_;
      auVar81._12_4_ = fVar20 * auVar63._12_4_;
      auVar63 = *(undefined1 (*) [16])(ray + 0x50);
      auVar79 = vfmadd231ps_fma(auVar81,auVar63,auVar64);
      auVar64 = *(undefined1 (*) [16])(ray + 0x40);
      auVar89 = vfmadd231ps_fma(auVar79,auVar64,auVar83);
      auVar79 = vsubps_avx(auVar96,auVar108);
      auVar83 = vsubps_avx(auVar87,auVar109);
      auVar100._0_4_ = auVar96._0_4_ + auVar108._0_4_;
      auVar100._4_4_ = auVar96._4_4_ + auVar108._4_4_;
      auVar100._8_4_ = auVar96._8_4_ + auVar108._8_4_;
      auVar100._12_4_ = auVar96._12_4_ + auVar108._12_4_;
      auVar129._0_4_ = fVar2 + auVar109._0_4_;
      auVar129._4_4_ = fVar8 + auVar109._4_4_;
      auVar129._8_4_ = fVar9 + auVar109._8_4_;
      auVar129._12_4_ = fVar10 + auVar109._12_4_;
      fVar123 = auVar83._0_4_;
      auVar90._0_4_ = fVar123 * auVar100._0_4_;
      fVar126 = auVar83._4_4_;
      auVar90._4_4_ = fVar126 * auVar100._4_4_;
      fVar127 = auVar83._8_4_;
      auVar90._8_4_ = fVar127 * auVar100._8_4_;
      fVar128 = auVar83._12_4_;
      auVar90._12_4_ = fVar128 * auVar100._12_4_;
      auVar81 = vfmsub231ps_fma(auVar90,auVar79,auVar129);
      auVar80 = vsubps_avx(auVar95,auVar97);
      fVar13 = auVar80._0_4_;
      auVar130._0_4_ = auVar129._0_4_ * fVar13;
      fVar14 = auVar80._4_4_;
      auVar130._4_4_ = auVar129._4_4_ * fVar14;
      fVar15 = auVar80._8_4_;
      auVar130._8_4_ = auVar129._8_4_ * fVar15;
      fVar16 = auVar80._12_4_;
      auVar130._12_4_ = auVar129._12_4_ * fVar16;
      auVar103._0_4_ = auVar97._0_4_ + auVar95._0_4_;
      auVar103._4_4_ = auVar97._4_4_ + auVar95._4_4_;
      auVar103._8_4_ = auVar97._8_4_ + auVar95._8_4_;
      auVar103._12_4_ = auVar97._12_4_ + auVar95._12_4_;
      auVar87 = vfmsub231ps_fma(auVar130,auVar83,auVar103);
      fVar114 = auVar79._0_4_;
      auVar104._0_4_ = fVar114 * auVar103._0_4_;
      fVar117 = auVar79._4_4_;
      auVar104._4_4_ = fVar117 * auVar103._4_4_;
      fVar118 = auVar79._8_4_;
      auVar104._8_4_ = fVar118 * auVar103._8_4_;
      fVar119 = auVar79._12_4_;
      auVar104._12_4_ = fVar119 * auVar103._12_4_;
      auVar90 = vfmsub231ps_fma(auVar104,auVar80,auVar100);
      auVar101._0_4_ = fVar17 * auVar90._0_4_;
      auVar101._4_4_ = fVar18 * auVar90._4_4_;
      auVar101._8_4_ = fVar19 * auVar90._8_4_;
      auVar101._12_4_ = fVar20 * auVar90._12_4_;
      auVar87 = vfmadd231ps_fma(auVar101,auVar63,auVar87);
      auVar90 = vfmadd231ps_fma(auVar87,auVar64,auVar81);
      auVar81 = vsubps_avx(auVar97,auVar120);
      auVar58._0_4_ = auVar97._0_4_ + auVar120._0_4_;
      auVar58._4_4_ = auVar97._4_4_ + auVar120._4_4_;
      auVar58._8_4_ = auVar97._8_4_ + auVar120._8_4_;
      auVar58._12_4_ = auVar97._12_4_ + auVar120._12_4_;
      auVar97 = vsubps_avx(auVar108,auVar47);
      auVar48._0_4_ = auVar108._0_4_ + auVar47._0_4_;
      auVar48._4_4_ = auVar108._4_4_ + auVar47._4_4_;
      auVar48._8_4_ = auVar108._8_4_ + auVar47._8_4_;
      auVar48._12_4_ = auVar108._12_4_ + auVar47._12_4_;
      auVar108 = vsubps_avx(auVar109,auVar53);
      auVar71._0_4_ = auVar109._0_4_ + auVar53._0_4_;
      auVar71._4_4_ = auVar109._4_4_ + auVar53._4_4_;
      auVar71._8_4_ = auVar109._8_4_ + auVar53._8_4_;
      auVar71._12_4_ = auVar109._12_4_ + auVar53._12_4_;
      auVar84._0_4_ = auVar108._0_4_ * auVar48._0_4_;
      auVar84._4_4_ = auVar108._4_4_ * auVar48._4_4_;
      auVar84._8_4_ = auVar108._8_4_ * auVar48._8_4_;
      auVar84._12_4_ = auVar108._12_4_ * auVar48._12_4_;
      auVar87 = vfmsub231ps_fma(auVar84,auVar97,auVar71);
      auVar53._0_4_ = auVar81._0_4_ * auVar71._0_4_;
      auVar53._4_4_ = auVar81._4_4_ * auVar71._4_4_;
      auVar53._8_4_ = auVar81._8_4_ * auVar71._8_4_;
      auVar53._12_4_ = auVar81._12_4_ * auVar71._12_4_;
      auVar53 = vfmsub231ps_fma(auVar53,auVar108,auVar58);
      auVar59._0_4_ = auVar97._0_4_ * auVar58._0_4_;
      auVar59._4_4_ = auVar97._4_4_ * auVar58._4_4_;
      auVar59._8_4_ = auVar97._8_4_ * auVar58._8_4_;
      auVar59._12_4_ = auVar97._12_4_ * auVar58._12_4_;
      auVar109 = vfmsub231ps_fma(auVar59,auVar81,auVar48);
      auVar49._0_4_ = fVar17 * auVar109._0_4_;
      auVar49._4_4_ = fVar18 * auVar109._4_4_;
      auVar49._8_4_ = fVar19 * auVar109._8_4_;
      auVar49._12_4_ = fVar20 * auVar109._12_4_;
      auVar53 = vfmadd231ps_fma(auVar49,auVar63,auVar53);
      auVar109 = vfmadd231ps_fma(auVar53,auVar64,auVar87);
      auVar91._0_4_ = auVar109._0_4_ + auVar89._0_4_ + auVar90._0_4_;
      auVar91._4_4_ = auVar109._4_4_ + auVar89._4_4_ + auVar90._4_4_;
      auVar91._8_4_ = auVar109._8_4_ + auVar89._8_4_ + auVar90._8_4_;
      auVar91._12_4_ = auVar109._12_4_ + auVar89._12_4_ + auVar90._12_4_;
      auVar53 = vandps_avx(auVar115,auVar91);
      auVar60._0_4_ = auVar53._0_4_ * 1.1920929e-07;
      auVar60._4_4_ = auVar53._4_4_ * 1.1920929e-07;
      auVar60._8_4_ = auVar53._8_4_ * 1.1920929e-07;
      auVar60._12_4_ = auVar53._12_4_ * 1.1920929e-07;
      auVar53 = vminps_avx(auVar89,auVar90);
      auVar53 = vminps_avx(auVar53,auVar109);
      uVar32 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
      auVar85._0_8_ = uVar32 ^ 0x8000000080000000;
      auVar85._8_4_ = -auVar60._8_4_;
      auVar85._12_4_ = -auVar60._12_4_;
      auVar53 = vcmpps_avx(auVar53,auVar85,5);
      auVar87 = vmaxps_avx(auVar89,auVar90);
      auVar87 = vmaxps_avx(auVar87,auVar109);
      auVar87 = vcmpps_avx(auVar87,auVar60,2);
      auVar53 = vorps_avx(auVar53,auVar87);
      auVar87 = auVar76 & auVar53;
      auVar53 = vandps_avx(auVar53,auVar76);
      if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar87[0xf] < '\0'
         ) {
        auVar50._0_4_ = fVar114 * auVar78._0_4_;
        auVar50._4_4_ = fVar117 * auVar78._4_4_;
        auVar50._8_4_ = fVar118 * auVar78._8_4_;
        auVar50._12_4_ = fVar119 * auVar78._12_4_;
        auVar109 = vfmsub213ps_fma(auVar70,auVar83,auVar50);
        auVar72._0_4_ = auVar97._0_4_ * fVar123;
        auVar72._4_4_ = auVar97._4_4_ * fVar126;
        auVar72._8_4_ = auVar97._8_4_ * fVar127;
        auVar72._12_4_ = auVar97._12_4_ * fVar128;
        auVar86._0_4_ = fVar13 * auVar108._0_4_;
        auVar86._4_4_ = fVar14 * auVar108._4_4_;
        auVar86._8_4_ = fVar15 * auVar108._8_4_;
        auVar86._12_4_ = fVar16 * auVar108._12_4_;
        auVar120 = vfmsub213ps_fma(auVar108,auVar79,auVar72);
        auVar87 = vandps_avx(auVar115,auVar50);
        auVar108 = vandps_avx(auVar115,auVar72);
        auVar87 = vcmpps_avx(auVar87,auVar108,1);
        auVar109 = vblendvps_avx(auVar120,auVar109,auVar87);
        auVar92._0_4_ = auVar81._0_4_ * fVar114;
        auVar92._4_4_ = auVar81._4_4_ * fVar117;
        auVar92._8_4_ = auVar81._8_4_ * fVar118;
        auVar92._12_4_ = auVar81._12_4_ * fVar119;
        auVar120 = vfmsub213ps_fma(auVar81,auVar83,auVar86);
        auVar73._0_4_ = fVar123 * auVar57._0_4_;
        auVar73._4_4_ = fVar126 * auVar57._4_4_;
        auVar73._8_4_ = fVar127 * auVar57._8_4_;
        auVar73._12_4_ = fVar128 * auVar57._12_4_;
        auVar47 = vfmsub213ps_fma(auVar78,auVar80,auVar73);
        auVar87 = vandps_avx(auVar115,auVar73);
        auVar108 = vandps_avx(auVar115,auVar86);
        auVar87 = vcmpps_avx(auVar87,auVar108,1);
        auVar108 = vblendvps_avx(auVar120,auVar47,auVar87);
        auVar24._4_4_ = fVar14 * auVar70._4_4_;
        auVar24._0_4_ = fVar13 * auVar70._0_4_;
        auVar24._8_4_ = fVar15 * auVar70._8_4_;
        auVar24._12_4_ = fVar16 * auVar70._12_4_;
        auVar120 = vfmsub213ps_fma(auVar57,auVar79,auVar24);
        auVar47 = vfmsub213ps_fma(auVar97,auVar80,auVar92);
        auVar87 = vandps_avx(auVar115,auVar24);
        auVar97 = vandps_avx(auVar115,auVar92);
        auVar87 = vcmpps_avx(auVar87,auVar97,1);
        auVar87 = vblendvps_avx(auVar47,auVar120,auVar87);
        local_1aa8 = auVar25._0_4_;
        fStack_1aa4 = auVar25._4_4_;
        fStack_1aa0 = auVar25._8_4_;
        auVar61._0_4_ = auVar87._0_4_ * local_1aa8;
        auVar61._4_4_ = auVar87._4_4_ * fStack_1aa4;
        auVar61._8_4_ = auVar87._8_4_ * fStack_1aa0;
        auVar61._12_4_ = auVar87._12_4_ * fVar20;
        auVar63 = vfmadd213ps_fma(auVar63,auVar108,auVar61);
        auVar63 = vfmadd213ps_fma(auVar64,auVar109,auVar63);
        auVar62._0_4_ = auVar63._0_4_ + auVar63._0_4_;
        auVar62._4_4_ = auVar63._4_4_ + auVar63._4_4_;
        auVar62._8_4_ = auVar63._8_4_ + auVar63._8_4_;
        auVar62._12_4_ = auVar63._12_4_ + auVar63._12_4_;
        auVar93._0_4_ = auVar87._0_4_ * fVar2;
        auVar93._4_4_ = auVar87._4_4_ * fVar8;
        auVar93._8_4_ = auVar87._8_4_ * fVar9;
        auVar93._12_4_ = auVar87._12_4_ * fVar10;
        auVar63 = vfmadd213ps_fma(auVar96,auVar108,auVar93);
        auVar64 = vfmadd213ps_fma(auVar95,auVar109,auVar63);
        auVar63 = vrcpps_avx(auVar62);
        auVar111._8_4_ = 0x3f800000;
        auVar111._0_8_ = 0x3f8000003f800000;
        auVar111._12_4_ = 0x3f800000;
        auVar95 = vfnmadd213ps_fma(auVar63,auVar62,auVar111);
        auVar63 = vfmadd132ps_fma(auVar95,auVar63,auVar63);
        auVar94._0_4_ = auVar63._0_4_ * (auVar64._0_4_ + auVar64._0_4_);
        auVar94._4_4_ = auVar63._4_4_ * (auVar64._4_4_ + auVar64._4_4_);
        auVar94._8_4_ = auVar63._8_4_ * (auVar64._8_4_ + auVar64._8_4_);
        auVar94._12_4_ = auVar63._12_4_ * (auVar64._12_4_ + auVar64._12_4_);
        auVar63 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar94,2);
        auVar64 = vcmpps_avx(auVar94,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar63 = vandps_avx(auVar64,auVar63);
        uVar32 = CONCAT44(auVar62._4_4_,auVar62._0_4_);
        auVar107._0_8_ = uVar32 ^ 0x8000000080000000;
        auVar107._8_4_ = -auVar62._8_4_;
        auVar107._12_4_ = -auVar62._12_4_;
        auVar64 = vcmpps_avx(auVar107,auVar62,4);
        auVar63 = vandps_avx(auVar64,auVar63);
        auVar63 = vpslld_avx(auVar63,0x1f);
        auVar64 = vpsrad_avx(auVar63,0x1f);
        auVar63 = auVar53 & auVar64;
        auVar53 = vandps_avx(auVar64,auVar53);
        if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar63[0xf] < '\0') {
          local_1908 = auVar87;
          local_18f8 = auVar108;
          local_18e8 = auVar109;
          local_18d8 = auVar94;
          local_18c8 = auVar91;
          _local_18b8 = auVar90;
          _local_18a8 = auVar89;
        }
      }
      auVar122 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar113 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      uVar3 = *(uint *)((long)&local_17d8 + lVar39 * 4);
      pGVar6 = (context->scene->geometries).items[uVar3].ptr;
      uVar27 = pGVar6->mask;
      auVar51._4_4_ = uVar27;
      auVar51._0_4_ = uVar27;
      auVar51._8_4_ = uVar27;
      auVar51._12_4_ = uVar27;
      auVar63 = vpand_avx(auVar51,*(undefined1 (*) [16])(ray + 0x90));
      auVar63 = vpcmpeqd_avx(auVar63,_DAT_01f45a50);
      auVar64 = auVar53 & ~auVar63;
      if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar64[0xf] < '\0'
         ) {
        uVar28 = *(undefined4 *)((long)&local_17e8 + lVar39 * 4);
        auVar63 = vandnps_avx(auVar63,auVar53);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar64 = vandps_avx(auVar115,local_18c8);
          auVar53 = vrcpps_avx(local_18c8);
          auVar82._8_4_ = 0x3f800000;
          auVar82._0_8_ = 0x3f8000003f800000;
          auVar82._12_4_ = 0x3f800000;
          auVar87 = vfnmadd213ps_fma(auVar53,local_18c8,auVar82);
          auVar53 = vfmadd132ps_fma(auVar87,auVar53,auVar53);
          auVar65._8_4_ = 0x219392ef;
          auVar65._0_8_ = 0x219392ef219392ef;
          auVar65._12_4_ = 0x219392ef;
          auVar64 = vcmpps_avx(auVar64,auVar65,5);
          auVar64 = vandps_avx(auVar64,auVar53);
          auVar66._0_4_ = auVar64._0_4_ * (float)local_18a8._0_4_;
          auVar66._4_4_ = auVar64._4_4_ * (float)local_18a8._4_4_;
          auVar66._8_4_ = auVar64._8_4_ * fStack_18a0;
          auVar66._12_4_ = auVar64._12_4_ * fStack_189c;
          local_1748 = vminps_avx(auVar66,auVar82);
          auVar52._0_4_ = auVar64._0_4_ * (float)local_18b8._0_4_;
          auVar52._4_4_ = auVar64._4_4_ * (float)local_18b8._4_4_;
          auVar52._8_4_ = auVar64._8_4_ * fStack_18b0;
          auVar52._12_4_ = auVar64._12_4_ * fStack_18ac;
          local_1758 = vminps_avx(auVar52,auVar82);
          local_1798._0_8_ = local_18e8._0_8_;
          local_1798._8_8_ = local_18e8._8_8_;
          local_1798._16_8_ = local_18f8._0_8_;
          local_1798._24_8_ = local_18f8._8_8_;
          local_1798._32_8_ = local_1908._0_8_;
          local_1798._40_8_ = local_1908._8_8_;
          local_1768 = local_18d8._0_8_;
          uStack_1760 = local_18d8._8_8_;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v_1;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_1798.field_0);
          local_1738._4_4_ = uVar3;
          local_1738._0_4_ = uVar3;
          local_1738._8_4_ = uVar3;
          local_1738._12_4_ = uVar3;
          local_1798._0_8_ = Ng.field_0._0_8_;
          local_1798._8_8_ = Ng.field_0._8_8_;
          local_1798._16_8_ = Ng.field_0._16_8_;
          local_1798._24_8_ = Ng.field_0._24_8_;
          local_1798._32_8_ = Ng.field_0._32_8_;
          local_1798._40_8_ = Ng.field_0._40_8_;
          local_1768 = u.field_0._0_8_;
          uStack_1760 = u.field_0._8_8_;
          local_1748._4_4_ = uVar28;
          local_1748._0_4_ = uVar28;
          local_1748._8_4_ = uVar28;
          local_1748._12_4_ = uVar28;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_1724 = context->user->instID[0];
          local_1728 = uStack_1724;
          uStack_1720 = uStack_1724;
          uStack_171c = uStack_1724;
          uStack_1718 = context->user->instPrimID[0];
          uStack_1714 = uStack_1718;
          uStack_1710 = uStack_1718;
          uStack_170c = uStack_1718;
          auVar64 = *(undefined1 (*) [16])(ray + 0x80);
          auVar53 = vblendvps_avx(auVar64,(undefined1  [16])t.field_0,auVar63);
          *(undefined1 (*) [16])(ray + 0x80) = auVar53;
          args.valid = (int *)local_1a38;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1798;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          local_1a38 = auVar63;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&args);
          }
          if (local_1a38 == (undefined1  [16])0x0) {
            auVar63 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar63 = auVar63 ^ _DAT_01f46b70;
            auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar113 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar122 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          }
          else {
            p_Var7 = context->args->filter;
            if (p_Var7 == (RTCFilterFunctionN)0x0) {
              auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar113 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar122 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            }
            else {
              auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar113 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar122 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var7)(&args);
                auVar122 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar113 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar121 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
            }
            auVar53 = vpcmpeqd_avx(local_1a38,_DAT_01f45a50);
            auVar63 = auVar53 ^ _DAT_01f46b70;
            auVar74._8_4_ = 0xff800000;
            auVar74._0_8_ = 0xff800000ff800000;
            auVar74._12_4_ = 0xff800000;
            auVar53 = vblendvps_avx(auVar74,*(undefined1 (*) [16])(args.ray + 0x80),auVar53);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar53;
          }
          auVar53 = vpslld_avx(auVar63,0x1f);
          auVar63 = vpsrad_avx(auVar53,0x1f);
          auVar64 = vblendvps_avx(auVar64,*(undefined1 (*) [16])pRVar1,auVar53);
          *(undefined1 (*) [16])pRVar1 = auVar64;
        }
        auVar76 = vandnps_avx(auVar63,auVar76);
      }
      lVar39 = lVar39 + 1;
    } while ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar76[0xf] < '\0');
    auVar68 = ZEXT1664(local_1a58);
    auVar64 = vandps_avx(auVar76,local_1a58);
    lVar30 = local_1a10 + 1;
    lVar31 = lVar31 + 0x50;
    auVar76 = local_1a58 & auVar76;
    auVar63 = local_1a58;
    local_1a58 = auVar64;
  } while ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar76[0xf] < '\0');
  auVar63 = vpcmpeqd_avx(auVar63,auVar63);
  auVar54._0_4_ = local_1a58._0_4_ ^ auVar63._0_4_;
  auVar54._4_4_ = local_1a58._4_4_ ^ auVar63._4_4_;
  auVar54._8_4_ = local_1a58._8_4_ ^ auVar63._8_4_;
  auVar54._12_4_ = local_1a58._12_4_ ^ auVar63._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar54,(undefined1  [16])terminated.field_0);
  auVar63 = auVar63 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar63[0xf])
  goto LAB_015444eb;
  auVar68 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar75._8_4_ = 0xff800000;
  auVar75._0_8_ = 0xff800000ff800000;
  auVar75._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar75,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0154384b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }